

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper_tests.cpp
# Opt level: O2

void __thiscall dbwrapper_tests::iterator_ordering::test_method(iterator_ordering *this)

{
  long lVar1;
  bool bVar2;
  readonly_property<bool> rVar3;
  long lVar4;
  uint x;
  uint uVar5;
  iterator in_R8;
  iterator pvVar6;
  uint32_t *in_R9;
  iterator pvVar7;
  uint8_t *puVar8;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  assertion_result *in_stack_fffffffffffffcc0;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  uint32_t value_2;
  uint8_t key_2;
  uint8_t key_1;
  undefined3 uStack_1cb;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> it;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  assertion_result local_170;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  uint8_t key;
  undefined7 uStack_137;
  undefined1 local_130 [16];
  undefined1 *local_120;
  undefined8 local_118;
  size_t local_108;
  undefined4 local_100;
  CDBWrapper dbw;
  path local_88;
  path ph;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDirBase((path *)&local_88,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args);
  fs::operator/(&ph,(path *)&local_88,"iterator_ordering");
  std::filesystem::__cxx11::path::~path(&local_88);
  std::filesystem::__cxx11::path::path((path *)local_130,&ph.super_path);
  local_108 = 0x100000;
  local_100._0_1_ = true;
  local_100._1_1_ = false;
  local_100._2_1_ = false;
  local_100._3_1_ = false;
  CDBWrapper::CDBWrapper(&dbw,(DBParams *)local_130);
  std::filesystem::__cxx11::path::~path((path *)local_130);
  for (uVar5 = 0; uVar5 != 0x100; uVar5 = uVar5 + 1) {
    _key = CONCAT71(uStack_137,(char)uVar5);
    it._M_t.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
    super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
    super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl._0_4_ = uVar5 * uVar5;
    if ((uVar5 & 1) == 0) {
      local_148 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
      ;
      local_140 = "";
      local_158 = &boost::unit_test::basic_cstring<char_const>::null;
      local_150 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = (iterator)0x122;
      file.m_begin = (iterator)&local_148;
      msg.m_end = (iterator)in_R9;
      msg.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_158,msg)
      ;
      bVar2 = CDBWrapper::Write<unsigned_char,unsigned_int>(&dbw,&key,(uint *)&it,false);
      local_170.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)bVar2;
      local_170.m_message.px = (element_type *)0x0;
      local_170.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_180 = "dbw.Write(key, value)";
      local_178 = "";
      local_130[8] = false;
      local_130._0_8_ = &PTR__lazy_ostream_011481f0;
      local_120 = boost::unit_test::lazy_ostream::inst;
      local_118 = &local_180;
      local_190 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
      ;
      local_188 = "";
      in_R8 = &DAT_00000001;
      in_R9 = (uint32_t *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_170,(lazy_ostream *)local_130,1,0,WARN,(check_type)in_stack_fffffffffffffcc0
                 ,(size_t)&local_190,0x122);
      boost::detail::shared_count::~shared_count(&local_170.m_message.pn);
    }
  }
  it._M_t.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
  super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
  super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl =
       (__uniq_ptr_data<CDBIterator,_std::default_delete<CDBIterator>,_true,_true>)
       CDBWrapper::NewIterator(&dbw);
  for (uVar5 = 0; uVar5 != 0x100; uVar5 = uVar5 + 1) {
    _key_1 = CONCAT31(uStack_1cb,(char)uVar5);
    _key = CONCAT44(uStack_137._3_4_,uVar5 * uVar5);
    if ((uVar5 & 1) != 0) {
      local_1a8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
      ;
      local_1a0 = "";
      local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0x12b;
      file_00.m_begin = (iterator)&local_1a8;
      msg_00.m_end = (iterator)in_R9;
      msg_00.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1b8,
                 msg_00);
      bVar2 = CDBWrapper::Write<unsigned_char,unsigned_int>(&dbw,&key_1,(uint *)&key,false);
      local_170.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)bVar2;
      local_170.m_message.px = (element_type *)0x0;
      local_170.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_180 = "dbw.Write(key, value)";
      local_178 = "";
      local_130[8] = false;
      local_130._0_8_ = &PTR__lazy_ostream_011481f0;
      local_120 = boost::unit_test::lazy_ostream::inst;
      local_118 = &local_180;
      local_1c8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
      ;
      local_1c0 = "";
      in_R8 = &DAT_00000001;
      in_R9 = (uint32_t *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_170,(lazy_ostream *)local_130,1,0,WARN,(check_type)in_stack_fffffffffffffcc0
                 ,(size_t)&local_1c8,299);
      boost::detail::shared_count::~shared_count(&local_170.m_message.pn);
    }
  }
  _key = 0x8000000000;
  lVar4 = 0;
  do {
    if (lVar4 == 8) {
      std::unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_>::~unique_ptr(&it);
      CDBWrapper::~CDBWrapper(&dbw);
      std::filesystem::__cxx11::path::~path(&ph.super_path);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      __stack_chk_fail();
    }
    uVar5 = *(uint *)(&key + lVar4);
    local_130[0] = (char)uVar5;
    CDBIterator::Seek<unsigned_char>
              ((CDBIterator *)
               it._M_t.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
               super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
               super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl,(uchar *)local_130);
    while( true ) {
      _key_1 = uVar5;
      if (0xfe < uVar5) break;
      local_1e8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
      ;
      local_1e0 = "";
      local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_01.m_end = (iterator)0x133;
      file_01.m_begin = (iterator)&local_1e8;
      msg_01.m_end = (iterator)in_R9;
      msg_01.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1f8,
                 msg_01);
      bVar2 = CDBIterator::Valid((CDBIterator *)
                                 it._M_t.
                                 super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>
                                 .super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl);
      local_170.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)bVar2;
      local_170.m_message.px = (element_type *)0x0;
      local_170.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_180 = "it->Valid()";
      local_178 = "";
      local_130[8] = false;
      local_130._0_8_ = &PTR__lazy_ostream_011481f0;
      local_120 = boost::unit_test::lazy_ostream::inst;
      local_118 = &local_180;
      local_208 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
      ;
      local_200 = "";
      in_R8 = &DAT_00000001;
      in_R9 = (uint32_t *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_170,(lazy_ostream *)local_130,1,0,WARN,(check_type)in_stack_fffffffffffffcc0
                 ,(size_t)&local_208,0x133);
      boost::detail::shared_count::~shared_count(&local_170.m_message.pn);
      bVar2 = CDBIterator::Valid((CDBIterator *)
                                 it._M_t.
                                 super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>
                                 .super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl);
      if (!bVar2) break;
      local_218 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
      ;
      local_210 = "";
      local_228 = &boost::unit_test::basic_cstring<char_const>::null;
      local_220 = &boost::unit_test::basic_cstring<char_const>::null;
      file_02.m_end = (iterator)0x136;
      file_02.m_begin = (iterator)&local_218;
      msg_02.m_end = (iterator)in_R9;
      msg_02.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_228,
                 msg_02);
      rVar3.super_class_property<bool>.value =
           (class_property<bool>)
           CDBIterator::GetKey<unsigned_char>
                     ((CDBIterator *)
                      it._M_t.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>.
                      _M_t.super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
                      super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl,&key_2);
      local_170.m_message.px = (element_type *)0x0;
      local_170.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_180 = "it->GetKey(key)";
      local_178 = "";
      local_130[8] = false;
      local_130._0_8_ = &PTR__lazy_ostream_011481f0;
      local_120 = boost::unit_test::lazy_ostream::inst;
      local_118 = &local_180;
      local_238 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
      ;
      local_230 = "";
      pvVar6 = &DAT_00000001;
      pvVar7 = (iterator)0x0;
      local_170.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)rVar3.super_class_property<bool>.value;
      boost::test_tools::tt_detail::report_assertion
                (&local_170,(lazy_ostream *)local_130,1,0,WARN,(check_type)in_stack_fffffffffffffcc0
                 ,(size_t)&local_238,0x136);
      boost::detail::shared_count::~shared_count(&local_170.m_message.pn);
      if ((_key_1 & 1) == 0) {
        local_278 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
        ;
        local_270 = "";
        local_288 = &boost::unit_test::basic_cstring<char_const>::null;
        local_280 = &boost::unit_test::basic_cstring<char_const>::null;
        file_03.m_end = (iterator)0x13b;
        file_03.m_begin = (iterator)&local_278;
        msg_03.m_end = pvVar7;
        msg_03.m_begin = pvVar6;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_288
                   ,msg_03);
        local_170.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)
             CDBIterator::GetValue<unsigned_int>
                       ((CDBIterator *)
                        it._M_t.
                        super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
                        super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
                        super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl,&value_2);
        local_170.m_message.px = (element_type *)0x0;
        local_170.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_180 = "it->GetValue(value)";
        local_178 = "";
        local_130[8] = false;
        local_130._0_8_ = &PTR__lazy_ostream_011481f0;
        local_120 = boost::unit_test::lazy_ostream::inst;
        local_118 = &local_180;
        local_298 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
        ;
        local_290 = "";
        pvVar6 = &DAT_00000001;
        pvVar7 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (&local_170,(lazy_ostream *)local_130,1,0,WARN,
                   (check_type)in_stack_fffffffffffffcc0,(size_t)&local_298,0x13b);
        boost::detail::shared_count::~shared_count(&local_170.m_message.pn);
        local_2a8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
        ;
        local_2a0 = "";
        local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_04.m_end = (iterator)0x13c;
        file_04.m_begin = (iterator)&local_2a8;
        msg_04.m_end = pvVar7;
        msg_04.m_begin = pvVar6;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_2b8
                   ,msg_04);
        local_130[8] = false;
        local_130._0_8_ = &PTR__lazy_ostream_011480b0;
        local_120 = boost::unit_test::lazy_ostream::inst;
        local_118 = (long)"\x05\x04\x03\x02\x01" + 5;
        local_2c8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
        ;
        local_2c0 = "";
        pvVar6 = (iterator)0x2;
        puVar8 = &key_2;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,unsigned_int>
                  ((lazy_ostream *)local_130,&local_2c8,0x13c,1,2,puVar8,"key",&key_1,"x");
        local_2d8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
        ;
        local_2d0 = "";
        local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_05.m_end = (iterator)0x13d;
        file_05.m_begin = (iterator)&local_2d8;
        msg_05.m_end = (iterator)puVar8;
        msg_05.m_begin = pvVar6;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_2e8
                   ,msg_05);
        local_130[8] = false;
        local_130._0_8_ = &PTR__lazy_ostream_011480b0;
        local_120 = boost::unit_test::lazy_ostream::inst;
        local_118 = (long)"\x05\x04\x03\x02\x01" + 5;
        local_2f8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
        ;
        local_2f0 = "";
        local_170._0_4_ = _key_1 * _key_1;
        in_stack_fffffffffffffcc0 = &local_170;
        in_R8 = (iterator)0x2;
        in_R9 = &value_2;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
                  ((lazy_ostream *)local_130,&local_2f8,0x13d,1,2,in_R9,"value",
                   in_stack_fffffffffffffcc0,"x*x");
        CDBIterator::Next((CDBIterator *)
                          it._M_t.
                          super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t
                          .super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
                          super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl);
      }
      else {
        local_248 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
        ;
        local_240 = "";
        local_258 = &boost::unit_test::basic_cstring<char_const>::null;
        local_250 = &boost::unit_test::basic_cstring<char_const>::null;
        file_06.m_end = (iterator)0x138;
        file_06.m_begin = (iterator)&local_248;
        msg_06.m_end = pvVar7;
        msg_06.m_begin = pvVar6;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_258
                   ,msg_06);
        local_130[8] = false;
        local_130._0_8_ = &PTR__lazy_ostream_011480b0;
        local_120 = boost::unit_test::lazy_ostream::inst;
        local_118 = (long)"\x05\x04\x03\x02\x01" + 5;
        local_268 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
        ;
        local_260 = "";
        local_170._0_4_ = _key_1 + 1;
        in_stack_fffffffffffffcc0 = &local_170;
        in_R8 = (iterator)0x2;
        in_R9 = (uint32_t *)&key_2;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,unsigned_int>
                  ((lazy_ostream *)local_130,&local_268,0x138,1,2,in_R9,"key",
                   in_stack_fffffffffffffcc0,"x + 1");
      }
      uVar5 = _key_1 + 1;
    }
    local_308 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_300 = "";
    local_318 = &boost::unit_test::basic_cstring<char_const>::null;
    local_310 = &boost::unit_test::basic_cstring<char_const>::null;
    file_07.m_end = (iterator)0x140;
    file_07.m_begin = (iterator)&local_308;
    msg_07.m_end = (iterator)in_R9;
    msg_07.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_318,
               msg_07);
    bVar2 = CDBIterator::Valid((CDBIterator *)
                               it._M_t.
                               super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>
                               .super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl);
    local_170.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)!bVar2;
    local_170.m_message.px = (element_type *)0x0;
    local_170.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_180 = "!it->Valid()";
    local_178 = "";
    local_130[8] = false;
    local_130._0_8_ = &PTR__lazy_ostream_011481f0;
    local_120 = boost::unit_test::lazy_ostream::inst;
    local_118 = &local_180;
    local_328 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_320 = "";
    in_R8 = &DAT_00000001;
    in_R9 = (uint32_t *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_170,(lazy_ostream *)local_130,1,0,WARN,(check_type)in_stack_fffffffffffffcc0,
               (size_t)&local_328,0x140);
    boost::detail::shared_count::~shared_count(&local_170.m_message.pn);
    lVar4 = lVar4 + 4;
  } while( true );
}

Assistant:

BOOST_AUTO_TEST_CASE(iterator_ordering)
{
    fs::path ph = m_args.GetDataDirBase() / "iterator_ordering";
    CDBWrapper dbw({.path = ph, .cache_bytes = 1 << 20, .memory_only = true, .wipe_data = false, .obfuscate = false});
    for (int x=0x00; x<256; ++x) {
        uint8_t key = x;
        uint32_t value = x*x;
        if (!(x & 1)) BOOST_CHECK(dbw.Write(key, value));
    }

    // Check that creating an iterator creates a snapshot
    std::unique_ptr<CDBIterator> it(const_cast<CDBWrapper&>(dbw).NewIterator());

    for (unsigned int x=0x00; x<256; ++x) {
        uint8_t key = x;
        uint32_t value = x*x;
        if (x & 1) BOOST_CHECK(dbw.Write(key, value));
    }

    for (const int seek_start : {0x00, 0x80}) {
        it->Seek((uint8_t)seek_start);
        for (unsigned int x=seek_start; x<255; ++x) {
            uint8_t key;
            uint32_t value;
            BOOST_CHECK(it->Valid());
            if (!it->Valid()) // Avoid spurious errors about invalid iterator's key and value in case of failure
                break;
            BOOST_CHECK(it->GetKey(key));
            if (x & 1) {
                BOOST_CHECK_EQUAL(key, x + 1);
                continue;
            }
            BOOST_CHECK(it->GetValue(value));
            BOOST_CHECK_EQUAL(key, x);
            BOOST_CHECK_EQUAL(value, x*x);
            it->Next();
        }
        BOOST_CHECK(!it->Valid());
    }
}